

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

void gai_iterator_init(Integer g_a,Integer *lo,Integer *hi,_iterator_hdl *hdl)

{
  Integer *np;
  global_array_t *pgVar1;
  short sVar2;
  undefined1 auVar3 [16];
  global_array_t *pgVar4;
  int iVar5;
  Integer IVar6;
  Integer *map;
  Integer *proclist;
  int *piVar7;
  long lVar8;
  logical lVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char err_string [256];
  char local_138 [264];
  
  lVar13 = g_a + 1000;
  sVar2 = GA[lVar13].ndim;
  lVar12 = (long)sVar2;
  IVar6 = pnga_pgroup_nnodes((long)GA[lVar13].p_handle);
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  map = (Integer *)malloc(IVar6 * 0xe00000000 >> 0x1d | 8);
  hdl->map = map;
  proclist = (Integer *)malloc((IVar6 << 0x20) >> 0x1d);
  hdl->proclist = proclist;
  piVar7 = (int *)malloc((IVar6 << 0x20) >> 0x1e);
  hdl->proclistperm = piVar7;
  if (0 < lVar12) {
    lVar8 = 0;
    do {
      hdl->lo[lVar8] = lo[lVar8];
      hdl->hi[lVar8] = hi[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar12 != lVar8);
  }
  pgVar4 = GA;
  if ((uint)GA[lVar13].distr_type < 5) {
    pgVar1 = GA + lVar13;
    switch(GA[lVar13].distr_type) {
    case 0:
      np = &hdl->nproc;
      lVar9 = pnga_locate_region(g_a,lo,hi,map,proclist,np);
      if (lVar9 == 0) {
        builtin_strncpy(local_138,"cannot locate region: ",0x17);
        strcpy(local_138 + 0x16,GA[lVar13].name);
        sVar10 = strlen(local_138);
        sprintf(local_138 + (int)sVar10," [%ld:%ld ",*lo,*hi);
        sVar10 = strlen(local_138);
        iVar5 = (int)sVar10;
        IVar6 = pnga_ndim(g_a);
        if (1 < IVar6) {
          lVar13 = 1;
          do {
            sprintf(local_138 + (int)sVar10,",%ld:%ld ",lo[lVar13],hi[lVar13]);
            sVar10 = strlen(local_138);
            iVar5 = (int)sVar10;
            lVar13 = lVar13 + 1;
            IVar6 = pnga_ndim(g_a);
          } while (lVar13 < IVar6);
        }
        (local_138 + iVar5)[0] = ']';
        (local_138 + iVar5)[1] = '\0';
        pnga_error(local_138,g_a);
      }
      lVar13 = *np;
      if (lVar13 == 1) {
        *hdl->proclistperm = 0;
      }
      else {
        if (GAnproc < lVar13) {
          pnga_error("permute_proc: error ",lVar13);
        }
        srand((uint)GAme);
        auVar3 = _DAT_0020b020;
        lVar13 = *np;
        if (0 < lVar13) {
          piVar7 = hdl->proclistperm;
          lVar12 = lVar13 + -1;
          auVar15._8_4_ = (int)lVar12;
          auVar15._0_8_ = lVar12;
          auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
          uVar11 = 0;
          auVar15 = auVar15 ^ _DAT_0020b020;
          auVar16 = _DAT_0020b040;
          do {
            auVar17 = auVar16 ^ auVar3;
            if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                        auVar15._4_4_ < auVar17._4_4_) & 1)) {
              piVar7[uVar11] = (int)uVar11;
            }
            if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
                auVar17._12_4_ <= auVar15._12_4_) {
              piVar7[uVar11 + 1] = (int)uVar11 + 1;
            }
            uVar11 = uVar11 + 2;
            lVar12 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 2;
            auVar16._8_8_ = lVar12 + 2;
          } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar11);
        }
        if (0 < *np) {
          lVar13 = 0;
          do {
            iVar5 = rand();
            lVar12 = (long)iVar5 % hdl->nproc;
            piVar7 = hdl->proclistperm;
            iVar5 = piVar7[lVar12];
            piVar7[lVar12] = piVar7[lVar13];
            piVar7[lVar13] = iVar5;
            lVar13 = lVar13 + 1;
          } while (lVar13 < hdl->nproc);
        }
      }
      break;
    case 1:
      hdl->iproc = 0;
      IVar6 = pnga_nodeid();
      hdl->iblock = IVar6;
      break;
    case 2:
      if (0 < sVar2) {
        lVar13 = 0;
        do {
          hdl->blk_size[lVar13] = pgVar4[g_a + 1000].block_dims[lVar13];
          lVar14 = (long)pgVar4[g_a + 1000].nblock[lVar13] * pgVar4[g_a + 1000].block_dims[lVar13];
          hdl->blk_dim[lVar13] = lVar14;
          lVar8 = pgVar4[g_a + 1000].dims[lVar13] / lVar14;
          hdl->blk_num[lVar13] = lVar8;
          lVar14 = pgVar4[g_a + 1000].dims[lVar13] - lVar14 * lVar8;
          hdl->blk_inc[lVar13] = lVar14;
          hdl->blk_ld[lVar13] = lVar8 * pgVar4[g_a + 1000].block_dims[lVar13];
          hdl->hlf_blk[lVar13] = lVar14 / pgVar4[g_a + 1000].block_dims[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar12 != lVar13);
      }
      hdl->offset = 0;
      hdl->iproc = 0;
      sVar2 = pgVar1->ndim;
      lVar13 = (long)sVar2;
      hdl->proc_index[0] = 0;
      if (1 < lVar13) {
        IVar6 = hdl->proc_index[0];
        lVar8 = 0;
        lVar12 = 0;
        do {
          lVar12 = (lVar12 - IVar6) / (long)pgVar4[g_a + 1000].nblock[lVar8];
          IVar6 = lVar12 % (long)pgVar4[g_a + 1000].nblock[lVar8 + 1];
          hdl->proc_index[lVar8 + 1] = IVar6;
          lVar8 = lVar8 + 1;
        } while (lVar13 + -1 != lVar8);
      }
      hdl->index[0] = 0;
      if (1 < sVar2) {
        IVar6 = hdl->index[0];
        lVar8 = 0;
        lVar12 = 0;
        do {
          lVar12 = (lVar12 - IVar6) / (long)pgVar4[g_a + 1000].nblock[lVar8];
          IVar6 = lVar12 % (long)pgVar4[g_a + 1000].nblock[lVar8 + 1];
          hdl->index[lVar8 + 1] = IVar6;
          lVar8 = lVar8 + 1;
        } while (lVar13 + -1 != lVar8);
      }
      break;
    case 3:
      hdl->offset = 0;
      hdl->iproc = 0;
      if (0 < sVar2) {
        lVar8 = 0;
        do {
          hdl->blk_size[lVar8] = pgVar4[lVar13].block_dims[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar12 != lVar8);
      }
      sVar2 = pgVar1->ndim;
      lVar13 = (long)sVar2;
      hdl->proc_index[0] = 0;
      if (1 < lVar13) {
        IVar6 = hdl->proc_index[0];
        lVar8 = 0;
        lVar12 = 0;
        do {
          lVar12 = (lVar12 - IVar6) / (long)pgVar4[g_a + 1000].nblock[lVar8];
          IVar6 = lVar12 % (long)pgVar4[g_a + 1000].nblock[lVar8 + 1];
          hdl->proc_index[lVar8 + 1] = IVar6;
          lVar8 = lVar8 + 1;
        } while (lVar13 + -1 != lVar8);
      }
      hdl->index[0] = 0;
      if (1 < sVar2) {
        IVar6 = hdl->index[0];
        lVar8 = 0;
        lVar12 = 0;
        do {
          lVar12 = (lVar12 - IVar6) / (long)pgVar4[g_a + 1000].nblock[lVar8];
          IVar6 = lVar12 % (long)pgVar4[g_a + 1000].nblock[lVar8 + 1];
          hdl->index[lVar8 + 1] = IVar6;
          lVar8 = lVar8 + 1;
        } while (lVar13 + -1 != lVar8);
      }
      break;
    case 4:
      hdl->offset = 0;
      hdl->iproc = 0;
      hdl->mapc = pgVar4[lVar13].mapc;
      sVar2 = pgVar1->ndim;
      lVar13 = (long)sVar2;
      hdl->proc_index[0] = 0;
      if (1 < lVar13) {
        IVar6 = hdl->proc_index[0];
        lVar8 = 0;
        lVar12 = 0;
        do {
          lVar12 = (lVar12 - IVar6) / (long)pgVar4[g_a + 1000].nblock[lVar8];
          IVar6 = lVar12 % (long)pgVar4[g_a + 1000].nblock[lVar8 + 1];
          hdl->proc_index[lVar8 + 1] = IVar6;
          lVar8 = lVar8 + 1;
        } while (lVar13 + -1 != lVar8);
      }
      hdl->index[0] = 0;
      if (1 < sVar2) {
        IVar6 = hdl->index[0];
        lVar8 = 0;
        lVar12 = 0;
        do {
          lVar12 = (lVar12 - IVar6) / (long)pgVar4[g_a + 1000].nblock[lVar8];
          IVar6 = lVar12 % (long)pgVar4[g_a + 1000].nblock[lVar8 + 1];
          hdl->index[lVar8 + 1] = IVar6;
          lVar8 = lVar8 + 1;
        } while (lVar13 + -1 != lVar8);
      }
    }
  }
  return;
}

Assistant:

void gai_iterator_init(Integer g_a, Integer lo[], Integer hi[],
                       _iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + g_a;
  Integer ndim = GA[handle].ndim;
  int grp = GA[handle].p_handle;
  int nproc = pnga_pgroup_nnodes(grp);
  Integer i;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  hdl->map = malloc((size_t)(nproc*2*MAXDIM+1)*sizeof(Integer));
  hdl->proclist = malloc(nproc*sizeof(Integer));;
  hdl->proclistperm = malloc(nproc*sizeof(int));
  for (i=0; i<ndim; i++) {
    hdl->lo[i] = lo[i];
    hdl->hi[i] = hi[i];
  }
  /* Standard GA distribution */
  if (GA[handle].distr_type == REGULAR) {
    /* Locate the processors containing some portion of the patch
     * specified by lo and hi and return the results in hdl->map,
     * hdl->proclist, and np. hdl->proclist contains a list of processors
     * containing some portion of the patch, hdl->map contains
     * the lower and upper indices of the portion of the patch held
     * by a given processor, and np contains the total number of
     * processors that contain some portion of the patch.
     */
    if(!pnga_locate_region(g_a, lo, hi, hdl->map, hdl->proclist, &hdl->nproc ))
      ga_RegionError(pnga_ndim(g_a), lo, hi, g_a);

    gaPermuteProcList(hdl->nproc, hdl->proclistperm);

    /* Block-cyclic distribution */
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* GA uses simple block cyclic data distribution */
    hdl->iproc = 0;
    hdl->iblock = pnga_nodeid();
  } else if (GA[handle].distr_type == SCALAPACK)  {
    /* GA uses ScaLAPACK block cyclic data distribution */
    int j;
    C_Integer *block_dims;
    /* Scalapack-type block-cyclic data distribution */
    /* Calculate some properties associated with data distribution */
    int *proc_grid = GA[handle].nblock;
    /*num_blocks = GA[handle].num_blocks;*/
    block_dims = GA[handle].block_dims;
    /* blk_dim: length of one repeat unit
     * blk_num: number of repeat units
     * blk_inc: number of elements in last incomplete repeat unit
     * blk_ld: length of complete blocks in repeat unit. Does not
     *         account for partial block at end
     * hlf_blk: number of full blocks in partial repeat unit
     */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = block_dims[j];
      hdl->blk_dim[j] = block_dims[j]*proc_grid[j];
      hdl->blk_num[j] = GA[handle].dims[j]/hdl->blk_dim[j];
      hdl->blk_inc[j] = GA[handle].dims[j]-hdl->blk_num[j]*hdl->blk_dim[j];
      hdl->blk_ld[j] = hdl->blk_num[j]*block_dims[j];
      hdl->hlf_blk[j] = hdl->blk_inc[j]/block_dims[j];
    }
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED)  {
    int j;
    C_Integer *block_dims;
    hdl->iproc = 0;
    hdl->offset = 0;
    block_dims = GA[handle].block_dims;
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = block_dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED_IRREG)  {
    int j;
    hdl->iproc = 0;
    hdl->offset = 0;
    hdl->mapc =  GA[handle].mapc;
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  }
}